

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O1

void __thiscall GrpLexer::mLIT_UHEX(GrpLexer *this,bool _createToken)

{
  bool bVar1;
  int el;
  Token *pTVar2;
  ScannerException *this_00;
  long *plVar3;
  Token *pTVar4;
  size_type *psVar5;
  int iVar6;
  RefToken _token;
  string local_78;
  RefCount<Token> local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58.ref = (Ref *)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"U+","");
  (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x17])(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  iVar6 = 0;
  while( true ) {
    el = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
    bVar1 = BitSet::member(&_tokenSet_3,el);
    if (!bVar1) break;
    mXDIGIT(this,false);
    iVar6 = iVar6 + -1;
  }
  if (iVar6 != 0) {
    if (_createToken) {
      if (local_58.ref == (Ref *)0x0) {
        pTVar2 = (Token *)0x0;
      }
      else {
        pTVar2 = (local_58.ref)->ptr;
      }
      if (nullToken.ref == (Ref *)0x0) {
        pTVar4 = (Token *)0x0;
      }
      else {
        pTVar4 = (nullToken.ref)->ptr;
      }
      if (pTVar2 == pTVar4) {
        (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x13])(&local_78,this,0x1b);
        RefCount<Token>::operator=(&local_58,(RefCount<Token> *)&local_78);
        RefCount<Token>::~RefCount((RefCount<Token> *)&local_78);
        if (local_58.ref == (Ref *)0x0) {
          pTVar2 = (Token *)0x0;
        }
        else {
          pTVar2 = (local_58.ref)->ptr;
        }
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&(this->super_CharScanner).text);
        (*pTVar2->_vptr_Token[6])(pTVar2,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
    }
    RefCount<Token>::operator=(&(this->super_CharScanner)._returnToken,&local_58);
    RefCount<Token>::~RefCount(&local_58);
    return;
  }
  this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"no viable alt for char: ","");
  iVar6 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
  CharScanner::charName(iVar6);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  local_78._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_78._M_dataplus._M_p == psVar5) {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78.field_2._8_4_ = (undefined4)plVar3[3];
    local_78.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar5;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar6 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0xf])(this);
  ScannerException::ScannerException(this_00,&local_78,iVar6);
  __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void GrpLexer::mLIT_UHEX(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = LIT_UHEX;
	
	match("U+");
	{
	int _cnt450=0;
	do {
		if ((_tokenSet_3.member(LA(1)))) {
			mXDIGIT(false);
		}
		else {
			if ( _cnt450>=1 ) { goto _loop450; } else {throw ScannerException(std::string("no viable alt for char: ")+charName(LA(1)),getLine());}
		}
		
		_cnt450++;
	} while (true);
	_loop450:;
	}
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}